

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NUMAMemoryPool.cpp
# Opt level: O0

IMemoryPool * __thiscall xmrig::NUMAMemoryPool::getOrCreate(NUMAMemoryPool *this,uint32_t node)

{
  value_type *__x;
  NUMAMemoryPool *in_RDI;
  IMemoryPool *pool;
  undefined8 in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  pair<const_unsigned_int,_xmrig::IMemoryPool_*> local_38 [2];
  value_type *local_18;
  uint local_c [3];
  
  local_18 = (value_type *)get(in_RDI,(uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  if (local_18 == (value_type *)0x0) {
    __x = (value_type *)operator_new(0x20);
    MemoryPool::MemoryPool
              ((MemoryPool *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,SUB81((ulong)in_RDI >> 0x38,0),(uint32_t)in_RDI);
    local_18 = __x;
    std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>::
    pair<unsigned_int_&,_xmrig::IMemoryPool_*&,_true>(local_38,local_c,(IMemoryPool **)&local_18);
    std::
    map<unsigned_int,_xmrig::IMemoryPool_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_>_>
    ::insert((map<unsigned_int,_xmrig::IMemoryPool_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_xmrig::IMemoryPool_*>_>_>
              *)in_RDI,__x);
  }
  return (IMemoryPool *)local_18;
}

Assistant:

xmrig::IMemoryPool *xmrig::NUMAMemoryPool::getOrCreate(uint32_t node) const
{
    auto pool = get(node);
    if (!pool) {
        pool = new MemoryPool(m_nodeSize, m_hugePages, node);
        m_map.insert({ node, pool });
    }

    return pool;
}